

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImDrawList *draw_list;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindowTempData *lhs;
  float _x;
  float _y;
  ImGuiCol local_98;
  float local_94;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImU32 local_64;
  ImU32 local_60;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 IStack_54;
  float default_size;
  undefined1 local_4c [8];
  ImRect bb;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiButtonFlags flags_local;
  ImGuiDir dir_local;
  char *str_id_local;
  float fStack_10;
  ImVec2 size_local;
  
  pIVar1 = GImGui;
  unique0x10000253 = size;
  register0x00000000 = GetCurrentWindow();
  if ((register0x00000000->SkipItems & 1U) == 0) {
    bb.Max.x = (float)ImGuiWindow::GetID(register0x00000000,str_id,(char *)0x0);
    lhs = &stack0xffffffffffffffc8->DC;
    IStack_54 = operator+(&lhs->CursorPos,(ImVec2 *)((long)&str_id_local + 4));
    ImRect::ImRect((ImRect *)local_4c,&lhs->CursorPos,&stack0xffffffffffffffac);
    bg_col = (ImU32)GetFrameHeight();
    if (fStack_10 < (float)bg_col) {
      local_94 = -1.0;
    }
    else {
      local_94 = (pIVar1->Style).FramePadding.y;
    }
    ItemSize((ImVec2 *)((long)&str_id_local + 4),local_94);
    bVar2 = ItemAdd((ImRect *)local_4c,(ImGuiID)bb.Max.x,(ImRect *)0x0,0);
    if (bVar2) {
      g._0_4_ = flags;
      if (((pIVar1->LastItemData).InFlags & 2U) != 0) {
        g._0_4_ = flags | 0x400;
      }
      text_col._1_1_ =
           ButtonBehavior((ImRect *)local_4c,(ImGuiID)bb.Max.x,(bool *)((long)&text_col + 3),
                          (bool *)((long)&text_col + 2),(uint)g);
      if (((text_col._2_1_ & 1) == 0) || ((text_col._3_1_ & 1) == 0)) {
        local_98 = 0x15;
        if ((text_col._3_1_ & 1) != 0) {
          local_98 = 0x16;
        }
      }
      else {
        local_98 = 0x17;
      }
      local_60 = GetColorU32(local_98,1.0);
      local_64 = GetColorU32(0,1.0);
      RenderNavHighlight((ImRect *)local_4c,(ImGuiID)bb.Max.x,1);
      local_70.x = (float)local_4c._0_4_;
      local_70.y = (float)local_4c._4_4_;
      local_78 = bb.Min;
      RenderFrame((ImVec2)local_4c,bb.Min,local_60,true,(pIVar1->Style).FrameRounding);
      draw_list = stack0xffffffffffffffc8->DrawList;
      _x = ImMax<float>(0.0,(str_id_local._4_4_ - pIVar1->FontSize) * 0.5);
      _y = ImMax<float>(0.0,(fStack_10 - pIVar1->FontSize) * 0.5);
      ImVec2::ImVec2(&local_88,_x,_y);
      local_80 = operator+((ImVec2 *)local_4c,&local_88);
      RenderArrow(draw_list,local_80,local_64,dir,1.0);
      size_local.x._3_1_ = (bool)(text_col._1_1_ & 1);
    }
    else {
      size_local.x._3_1_ = false;
    }
  }
  else {
    size_local.x._3_1_ = false;
  }
  return size_local.x._3_1_;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (g.LastItemData.InFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, str_id, g.LastItemData.StatusFlags);
    return pressed;
}